

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_compute_table_impl.h
# Opt level: O0

void secp256k1_ecmult_gen_compute_table(secp256k1_ge_storage *table,secp256k1_ge *gen,int bits)

{
  secp256k1_gej *a;
  int in_EDX;
  secp256k1_gej *precj;
  secp256k1_gej numsbase;
  secp256k1_gej gbase;
  int r;
  secp256k1_ge nums_ge;
  secp256k1_fe nums_x;
  int j;
  int i;
  secp256k1_gej nums_gej;
  secp256k1_gej gj;
  secp256k1_ge *prec;
  int n;
  int g;
  secp256k1_ge *in_stack_fffffffffffffcc8;
  secp256k1_gej *in_stack_fffffffffffffcd0;
  size_t in_stack_fffffffffffffd00;
  secp256k1_gej *in_stack_fffffffffffffd08;
  secp256k1_ge *in_stack_fffffffffffffd10;
  secp256k1_ge *in_stack_fffffffffffffd28;
  secp256k1_ge_storage *in_stack_fffffffffffffd30;
  undefined1 local_298 [156];
  int local_1fc;
  int local_160;
  int local_15c;
  secp256k1_fe *in_stack_fffffffffffffea8;
  secp256k1_ge *in_stack_fffffffffffffeb0;
  secp256k1_gej *in_stack_fffffffffffffeb8;
  secp256k1_gej *in_stack_fffffffffffffec0;
  secp256k1_fe *in_stack_fffffffffffffed8;
  secp256k1_gej *in_stack_fffffffffffffee0;
  secp256k1_gej *in_stack_fffffffffffffee8;
  secp256k1_gej *in_stack_fffffffffffffef0;
  undefined1 local_c0 [152];
  void *local_28;
  int local_1c;
  int local_18;
  int local_14;
  
  local_18 = 1 << ((byte)in_EDX & 0x1f);
  local_1c = (int)(0x100 / (long)in_EDX);
  local_14 = in_EDX;
  local_28 = checked_malloc((secp256k1_callback *)in_stack_fffffffffffffcd0,
                            (size_t)in_stack_fffffffffffffcc8);
  if (local_18 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/ecmult_gen_compute_table_impl.h"
            ,0x19,"test condition failed: g > 0");
    abort();
  }
  if (local_1c < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/ecmult_gen_compute_table_impl.h"
            ,0x1a,"test condition failed: n > 0");
    abort();
  }
  secp256k1_gej_set_ge(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_1fc = secp256k1_fe_set_b32_limit(&in_stack_fffffffffffffcc8->x,(uchar *)0x10bd47);
  if (local_1fc == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/ecmult_gen_compute_table_impl.h"
            ,0x27,"test condition failed: r");
    abort();
  }
  local_1fc = secp256k1_ge_set_xo_var
                        ((secp256k1_ge *)in_stack_fffffffffffffcd0,&in_stack_fffffffffffffcc8->x,0);
  if (local_1fc == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/ecmult_gen_compute_table_impl.h"
            ,0x2a,"test condition failed: r");
    abort();
  }
  secp256k1_gej_set_ge(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  secp256k1_gej_add_ge_var
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  a = (secp256k1_gej *)
      checked_malloc((secp256k1_callback *)in_stack_fffffffffffffcd0,
                     (size_t)in_stack_fffffffffffffcc8);
  memcpy(local_298,local_c0,0x98);
  memcpy(&stack0xfffffffffffffcd0,&stack0xfffffffffffffea8,0x98);
  for (local_160 = 0; local_160 < local_1c; local_160 = local_160 + 1) {
    memcpy(a + local_160 * local_18,&stack0xfffffffffffffcd0,0x98);
    for (local_15c = 1; local_15c < local_18; local_15c = local_15c + 1) {
      secp256k1_gej_add_var
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8);
    }
    for (local_15c = 0; local_15c < local_14; local_15c = local_15c + 1) {
      secp256k1_gej_double_var(in_stack_fffffffffffffcd0,a,(secp256k1_fe *)0x10bf9f);
    }
    secp256k1_gej_double_var(in_stack_fffffffffffffcd0,a,(secp256k1_fe *)0x10bfc3);
    if (local_160 == local_1c + -2) {
      secp256k1_gej_neg(in_stack_fffffffffffffcd0,a);
      secp256k1_gej_add_var
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8);
    }
  }
  secp256k1_ge_set_all_gej_var
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  free(a);
  for (local_160 = 0; local_160 < local_1c; local_160 = local_160 + 1) {
    for (local_15c = 0; local_15c < local_18; local_15c = local_15c + 1) {
      secp256k1_ge_to_storage(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    }
  }
  free(local_28);
  return;
}

Assistant:

static void secp256k1_ecmult_gen_compute_table(secp256k1_ge_storage* table, const secp256k1_ge* gen, int bits) {
    int g = ECMULT_GEN_PREC_G(bits);
    int n = ECMULT_GEN_PREC_N(bits);

    secp256k1_ge* prec = checked_malloc(&default_error_callback, n * g * sizeof(*prec));
    secp256k1_gej gj;
    secp256k1_gej nums_gej;
    int i, j;

    VERIFY_CHECK(g > 0);
    VERIFY_CHECK(n > 0);

    /* get the generator */
    secp256k1_gej_set_ge(&gj, gen);

    /* Construct a group element with no known corresponding scalar (nothing up my sleeve). */
    {
        static const unsigned char nums_b32[33] = "The scalar for this x is unknown";
        secp256k1_fe nums_x;
        secp256k1_ge nums_ge;
        int r;
        r = secp256k1_fe_set_b32_limit(&nums_x, nums_b32);
        (void)r;
        VERIFY_CHECK(r);
        r = secp256k1_ge_set_xo_var(&nums_ge, &nums_x, 0);
        (void)r;
        VERIFY_CHECK(r);
        secp256k1_gej_set_ge(&nums_gej, &nums_ge);
        /* Add G to make the bits in x uniformly distributed. */
        secp256k1_gej_add_ge_var(&nums_gej, &nums_gej, gen, NULL);
    }

    /* compute prec. */
    {
        secp256k1_gej gbase;
        secp256k1_gej numsbase;
        secp256k1_gej* precj = checked_malloc(&default_error_callback, n * g * sizeof(*precj));  /* Jacobian versions of prec. */
        gbase = gj; /* PREC_G^j * G */
        numsbase = nums_gej; /* 2^j * nums. */
        for (j = 0; j < n; j++) {
            /* Set precj[j*PREC_G .. j*PREC_G+(PREC_G-1)] to (numsbase, numsbase + gbase, ..., numsbase + (PREC_G-1)*gbase). */
            precj[j*g] = numsbase;
            for (i = 1; i < g; i++) {
                secp256k1_gej_add_var(&precj[j*g + i], &precj[j*g + i - 1], &gbase, NULL);
            }
            /* Multiply gbase by PREC_G. */
            for (i = 0; i < bits; i++) {
                secp256k1_gej_double_var(&gbase, &gbase, NULL);
            }
            /* Multiply numbase by 2. */
            secp256k1_gej_double_var(&numsbase, &numsbase, NULL);
            if (j == n - 2) {
                /* In the last iteration, numsbase is (1 - 2^j) * nums instead. */
                secp256k1_gej_neg(&numsbase, &numsbase);
                secp256k1_gej_add_var(&numsbase, &numsbase, &nums_gej, NULL);
            }
        }
        secp256k1_ge_set_all_gej_var(prec, precj, n * g);
        free(precj);
    }
    for (j = 0; j < n; j++) {
        for (i = 0; i < g; i++) {
            secp256k1_ge_to_storage(&table[j*g + i], &prec[j*g + i]);
        }
    }
    free(prec);
}